

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void key_schedule_free(ptls_key_schedule_t *sched)

{
  size_t local_18;
  size_t i;
  ptls_key_schedule_t *sched_local;
  
  (*ptls_clear_memory)(sched->secret,0x40);
  for (local_18 = 0; local_18 != sched->num_hashes; local_18 = local_18 + 1) {
    (*(sched->hashes[local_18].ctx)->final)
              (sched->hashes[local_18].ctx,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
    if (sched->hashes[local_18].ctx_outer != (ptls_hash_context_t *)0x0) {
      (*(sched->hashes[local_18].ctx_outer)->final)
                (sched->hashes[local_18].ctx_outer,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
    }
  }
  free(sched);
  return;
}

Assistant:

static void key_schedule_free(ptls_key_schedule_t *sched)
{
    size_t i;
    ptls_clear_memory(sched->secret, sizeof(sched->secret));
    for (i = 0; i != sched->num_hashes; ++i) {
        sched->hashes[i].ctx->final(sched->hashes[i].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
        if (sched->hashes[i].ctx_outer != NULL)
            sched->hashes[i].ctx_outer->final(sched->hashes[i].ctx_outer, NULL, PTLS_HASH_FINAL_MODE_FREE);
    }
    free(sched);
}